

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MemoryLeakDetectorTest_periodEnabled_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_periodEnabled_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x1cc);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035bea8;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, periodEnabled)
{
    detector->enable();
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_disabled));
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_enabled));
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_checking));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}